

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreGCR.cpp
# Opt level: O0

uint Storage::Encodings::CommodoreGCR::encoding_for_nibble(uint8_t nibble)

{
  uint local_c;
  uint8_t nibble_local;
  
  switch(nibble & 0xf) {
  case 0:
    local_c = 10;
    break;
  case 1:
    local_c = 0xb;
    break;
  case 2:
    local_c = 0x12;
    break;
  case 3:
    local_c = 0x13;
    break;
  case 4:
    local_c = 0xe;
    break;
  case 5:
    local_c = 0xf;
    break;
  case 6:
    local_c = 0x16;
    break;
  case 7:
    local_c = 0x17;
    break;
  case 8:
    local_c = 9;
    break;
  case 9:
    local_c = 0x19;
    break;
  case 10:
    local_c = 0x1a;
    break;
  case 0xb:
    local_c = 0x1b;
    break;
  case 0xc:
    local_c = 0xd;
    break;
  case 0xd:
    local_c = 0x1d;
    break;
  case 0xe:
    local_c = 0x1e;
    break;
  case 0xf:
    local_c = 0x15;
    break;
  default:
    local_c = 0xff;
  }
  return local_c;
}

Assistant:

unsigned int Storage::Encodings::CommodoreGCR::encoding_for_nibble(uint8_t nibble) {
	switch(nibble & 0xf) {
		case 0x0:	return 0x0a;		case 0x1:	return 0x0b;
		case 0x2:	return 0x12;		case 0x3:	return 0x13;
		case 0x4:	return 0x0e;		case 0x5:	return 0x0f;
		case 0x6:	return 0x16;		case 0x7:	return 0x17;
		case 0x8:	return 0x09;		case 0x9:	return 0x19;
		case 0xa:	return 0x1a;		case 0xb:	return 0x1b;
		case 0xc:	return 0x0d;		case 0xd:	return 0x1d;
		case 0xe:	return 0x1e;		case 0xf:	return 0x15;

		// for the benefit of the compiler; clearly unreachable
		default:	return 0xff;
	}
}